

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_1a2934::cmQtAutoMocUicT::ParseCacheT::FileT::Clear(FileT *this)

{
  FileT *this_local;
  
  std::__cxx11::string::clear();
  std::
  vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
  ::clear(&(this->Moc).Include.Underscore);
  std::
  vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
  ::clear(&(this->Moc).Include.Dot);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->Moc).Depends);
  std::
  vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
  ::clear(&(this->Uic).Include);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->Uic).Depends);
  return;
}

Assistant:

void cmQtAutoMocUicT::ParseCacheT::FileT::Clear()
{
  this->Moc.Macro.clear();
  this->Moc.Include.Underscore.clear();
  this->Moc.Include.Dot.clear();
  this->Moc.Depends.clear();

  this->Uic.Include.clear();
  this->Uic.Depends.clear();
}